

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void ngai_has_negative_element
               (Integer atype,Integer andim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               Integer *iretval)

{
  double *pdVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long in_R9;
  undefined8 *in_stack_00000008;
  float *ftempA;
  long *ltempA;
  int *itempA;
  double *tempA;
  Integer n1dim;
  Integer idx;
  Integer baseldA [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer j;
  Integer i;
  long local_108;
  long local_100;
  long local_f8 [8];
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long local_10;
  undefined8 local_8;
  
  local_108 = 1;
  for (local_38 = 1; local_38 < in_RSI; local_38 = local_38 + 1) {
    local_108 = ((in_RCX[local_38] - in_RDX[local_38]) + 1) * local_108;
  }
  local_78[0] = 0;
  local_78[1] = 0;
  local_b8[0] = 1;
  local_b8[1] = 1;
  local_f8[0] = *in_R8;
  local_f8[1] = *in_R8 * in_R8[1];
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_38 = 2; local_38 < local_10; local_38 = local_38 + 1) {
    local_78[local_38] = 0;
    local_b8[local_38] =
         local_b8[local_38 + -1] * ((local_20[local_38 + -1] - local_18[local_38 + -1]) + 1);
    local_f8[local_38] = local_f8[local_38 + -1] * local_28[local_38];
  }
  *in_stack_00000008 = 0;
  for (local_38 = 0; local_38 < local_108; local_38 = local_38 + 1) {
    local_100 = 0;
    for (local_40 = 1; local_40 < local_10; local_40 = local_40 + 1) {
      local_100 = local_78[local_40] * local_f8[local_40 + -1] + local_100;
      if ((local_38 + 1) % local_b8[local_40] == 0) {
        local_78[local_40] = local_78[local_40] + 1;
      }
      if (local_20[local_40] - local_18[local_40] < local_78[local_40]) {
        local_78[local_40] = 0;
      }
    }
    switch(local_8) {
    case 0x3e9:
      for (local_40 = 0; local_40 < (*local_20 - *local_18) + 1; local_40 = local_40 + 1) {
        if (*(int *)(local_30 + local_100 * 4 + local_40 * 4) < 0) {
          *in_stack_00000008 = 1;
        }
      }
      break;
    case 0x3ea:
      for (local_40 = 0; local_40 < (*local_20 - *local_18) + 1; local_40 = local_40 + 1) {
        if (*(long *)(local_30 + local_100 * 8 + local_40 * 8) < 0) {
          *in_stack_00000008 = 1;
        }
      }
      break;
    case 0x3eb:
      for (local_40 = 0; local_40 < (*local_20 - *local_18) + 1; local_40 = local_40 + 1) {
        pfVar2 = (float *)(local_30 + local_100 * 4 + local_40 * 4);
        if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
          *in_stack_00000008 = 1;
        }
      }
      break;
    case 0x3ec:
      for (local_40 = 0; local_40 < (*local_20 - *local_18) + 1; local_40 = local_40 + 1) {
        pdVar1 = (double *)(local_30 + local_100 * 8 + local_40 * 8);
        if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
          *in_stack_00000008 = 1;
        }
      }
      break;
    default:
      pnga_error((char *)baseldA[6],baseldA[5]);
      break;
    case 0x3ee:
    case 0x3ef:
      pnga_error((char *)baseldA[6],baseldA[5]);
    }
  }
  return;
}

Assistant:

static void ngai_has_negative_element(Integer atype, Integer andim, Integer *loA, Integer *hiA, Integer *ldA, void *A_ptr, Integer *iretval)
{
  Integer i, j;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];
  Integer idx, n1dim;
  double *tempA;
  int    *itempA;
  long   *ltempA;
  float  *ftempA;

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<andim; i++) n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldA[0] = ldA[0]; baseldA[1] = baseldA[0] *ldA[1];
  for(i=2; i<andim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
    baseldA[i] = baseldA[i-1] * ldA[i];
  }

  *iretval = 0;
  for(i=0; i<n1dim; i++) {
    idx = 0;
    for(j=1; j<andim; j++) {
      idx += bvalue[j] * baseldA[j-1];
      if(((i+1) % bunit[j]) == 0) bvalue[j]++;
      if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
    }

    switch(atype){
      case C_DBL:
        /*double is the only type that is handled for Tao/GA project*/
        /* 
           DJB modification to add types int, float and long.
           This operation does not make sense for complex.
         */
        tempA=((double*)A_ptr)+idx;
        for(j=0;j<hiA[0]-loA[0]+1;j++)
          if(tempA[j]<(double)0.0) *iretval=1;
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error(" has_negative_elem: wrong data type ",
            atype);
        break;
      case C_INT:
        itempA=((int*)A_ptr)+idx;
        for(j=0;j<hiA[0]-loA[0]+1;j++)
          if(itempA[j]<(int)0) *iretval=1;
        break;
      case C_FLOAT:
        ftempA=((float*)A_ptr)+idx;
        for(j=0;j<hiA[0]-loA[0]+1;j++)
          if(ftempA[j]<(float)0.0) *iretval=1;
        break;
      case C_LONG:
        ltempA=((long*)A_ptr)+idx;
        for(j=0;j<hiA[0]-loA[0]+1;j++)
          if(ltempA[j]<(long)0) *iretval=1;
        break;

      default: pnga_error(" has_negative_elem: wrong data type ",
                   atype);
    }

  }
}